

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  string *config;
  pointer pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmGeneratorTarget *this_00;
  bool bVar3;
  cmLinkLineComputer *linkLineComputer;
  cmOutputConverter *outputConverter;
  string linkRuleVar_1;
  string linkRuleVar;
  string extraFlags;
  string linkLanguage;
  undefined1 local_d0 [40];
  string local_a8;
  string local_88;
  string local_68;
  cmStateSnapshot local_48;
  
  bVar3 = cmGeneratorTarget::IsFrameworkOnApple
                    ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                     GeneratorTarget);
  if (bVar3) {
    WriteFrameworkRules(this,relink);
    return;
  }
  if (!relink) {
    bVar3 = requireDeviceLinking
                      ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                       GeneratorTarget,
                       (cmLocalGenerator *)(this->super_cmMakefileTargetGenerator).LocalGenerator,
                       &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
                        ConfigName);
    if (bVar3) {
      local_d0._0_8_ = local_d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d0,"CMAKE_CUDA_DEVICE_LINK_LIBRARY","");
      WriteDeviceLibraryRules(this,(string *)local_d0,false);
      if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
        operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
      }
    }
  }
  config = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  cmGeneratorTarget::GetLinkerLanguage
            (&local_68,
             (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             config);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"CMAKE_","");
  std::__cxx11::string::_M_append((char *)&local_a8,(ulong)local_68._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_a8);
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,&local_88,&local_68);
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  pcVar1 = local_d0 + 0x10;
  local_d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"CMAKE_SHARED_LINKER_FLAGS","")
  ;
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)pcVar2,&local_88,(string *)local_d0,config);
  if ((pointer)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  outputConverter =
       &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  if (pcVar2 == (cmLocalUnixMakefileGenerator3 *)0x0) {
    outputConverter = (cmOutputConverter *)0x0;
  }
  cmLocalGenerator::GetStateSnapshot(&local_48,(cmLocalGenerator *)pcVar2);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_d0,&local_48);
  linkLineComputer =
       cmMakefileTargetGenerator::CreateLinkLineComputer
                 (&this->super_cmMakefileTargetGenerator,outputConverter,
                  (cmStateDirectory *)local_d0);
  cmCommonTargetGenerator::AddModuleDefinitionFlag
            ((cmCommonTargetGenerator *)this,linkLineComputer,&local_88);
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  local_d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"LINK_WHAT_YOU_USE","");
  bVar3 = cmGeneratorTarget::GetPropertyAsBool(this_00,(string *)local_d0);
  if ((pointer)local_d0._0_8_ != pcVar1) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if (bVar3) {
    pcVar2 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
    (*(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[7])
              (pcVar2,&local_88," -Wl,--no-as-needed");
  }
  WriteLibraryRules(this,&local_a8,&local_88,relink);
  if (linkLineComputer != (cmLinkLineComputer *)0x0) {
    (*linkLineComputer->_vptr_cmLinkLineComputer[1])(linkLineComputer);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteSharedLibraryRules(bool relink)
{
  if (this->GeneratorTarget->IsFrameworkOnApple()) {
    this->WriteFrameworkRules(relink);
    return;
  }

  if (!relink) {
    const bool requiresDeviceLinking = requireDeviceLinking(
      *this->GeneratorTarget, *this->LocalGenerator, this->ConfigName);
    if (requiresDeviceLinking) {
      std::string linkRuleVar = "CMAKE_CUDA_DEVICE_LINK_LIBRARY";
      this->WriteDeviceLibraryRules(linkRuleVar, relink);
    }
  }

  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
  std::string linkRuleVar = "CMAKE_";
  linkRuleVar += linkLanguage;
  linkRuleVar += "_CREATE_SHARED_LIBRARY";

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_SHARED_LINKER_FLAGS", this->ConfigName);

  std::unique_ptr<cmLinkLineComputer> linkLineComputer(
    this->CreateLinkLineComputer(
      this->LocalGenerator,
      this->LocalGenerator->GetStateSnapshot().GetDirectory()));

  this->AddModuleDefinitionFlag(linkLineComputer.get(), extraFlags);

  if (this->GeneratorTarget->GetPropertyAsBool("LINK_WHAT_YOU_USE")) {
    this->LocalGenerator->AppendFlags(extraFlags, " -Wl,--no-as-needed");
  }
  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}